

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

size_t __thiscall
CVmObjByteArray::copy_to_buf(CVmObjByteArray *this,uchar *buf,unsigned_long idx,size_t len)

{
  CVmObjByteArray *this_00;
  ulong in_RCX;
  CVmObjByteArray *in_RDX;
  void *in_RSI;
  size_t copy_len;
  uchar *p;
  size_t avail;
  unsigned_long contlen;
  size_t actual;
  size_t local_48;
  size_t *in_stack_ffffffffffffffc0;
  unsigned_long in_stack_ffffffffffffffc8;
  size_t local_28;
  ulong local_20;
  void *local_10;
  
  local_28 = 0;
  this_00 = (CVmObjByteArray *)get_element_count((CVmObjByteArray *)0x2c6d60);
  local_10 = in_RSI;
  if (this_00 < in_RDX) {
    local_20 = 0;
  }
  else {
    local_20 = in_RCX;
    if (this_00 < (CVmObjByteArray *)((long)&(in_RDX->super_CVmObject)._vptr_CVmObject + in_RCX)) {
      local_20 = (long)this_00 + (1 - (long)in_RDX);
    }
  }
  while ((local_20 != 0 &&
         (in_stack_ffffffffffffffc0 =
               (size_t *)get_ele_ptr(this_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
         in_stack_ffffffffffffffc8 != 0))) {
    local_48 = in_stack_ffffffffffffffc8;
    if (local_20 < in_stack_ffffffffffffffc8) {
      local_48 = local_20;
    }
    memcpy(local_10,in_stack_ffffffffffffffc0,local_48);
    local_10 = (void *)(local_48 + (long)local_10);
    local_20 = local_20 - local_48;
    local_28 = local_48 + local_28;
  }
  return local_28;
}

Assistant:

size_t CVmObjByteArray::copy_to_buf(unsigned char *buf,
                                    unsigned long idx, size_t len) const
{
    /* we haven't copied any bytes so far */
    size_t actual = 0;

    /* limit it to the actual available space */
    unsigned long contlen = get_element_count();
    if (idx > contlen)
        len = 0;
    else if (idx + len > contlen)
        len = contlen - idx + 1;

    /* keep going until we satisfy the request */
    while (len != 0)
    {
        size_t avail;
        unsigned char *p;
        size_t copy_len;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* if there's nothing left, stop */
        if (avail == 0)
            break;

        /* copy the available bytes or the reamining desired bytes */
        copy_len = avail;
        if (copy_len > len)
            copy_len = len;

        /* copy the bytes */
        memcpy(buf, p, copy_len);

        /* advance past the copied bytes */
        buf += copy_len;
        idx += copy_len;
        len -= copy_len;
        actual += copy_len;
    }

    /* return the actual size copied */
    return actual;
}